

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O3

int Cbs2_ManPropagate(Cbs2_Man_t *p,int Level)

{
  Gia_Obj_t *pGVar1;
  char cVar2;
  uint uVar3;
  int *piVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  
  do {
    iVar8 = (p->pProp).iHead;
    lVar14 = (long)iVar8;
    iVar10 = (p->pProp).iTail;
    if (iVar8 < iVar10) {
      uVar3 = (p->pProp).pData[lVar14];
      while (uVar3 != 0) {
        lVar14 = lVar14 + 1;
        if ((int)uVar3 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        iVar8 = Cbs2_ManPropagateOne(p,uVar3 >> 1,Level);
        if (iVar8 != 0) {
          return iVar8;
        }
        iVar10 = (p->pProp).iTail;
        if (iVar10 <= lVar14) break;
        uVar3 = (p->pProp).pData[lVar14];
      }
    }
    (p->pProp).iHead = iVar10;
    iVar8 = (p->pJust).iHead;
    iVar10 = (p->pJust).iTail;
    if (iVar8 < iVar10) {
      lVar14 = (long)iVar8;
      piVar4 = (p->pJust).pData;
      uVar3 = piVar4[lVar14];
      while (uVar3 != 0) {
        lVar14 = lVar14 + 1;
        if (((int)uVar3 < 0) || (p->pAig->nObjs <= (int)uVar3)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar5 = p->pAig->pObjs;
        pGVar1 = pGVar5 + uVar3;
        uVar6 = *(ulong *)(pGVar5 + uVar3);
        uVar11 = (uint)uVar6;
        if (((int)uVar11 < 0) || ((uVar11 & 0x1fffffff) == 0x1fffffff)) {
          if (((ulong)pGVar1 & 1) == 0) {
            __assert_fail("Gia_ObjIsAnd(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                          ,0x413,"int Cbs2_ManPropagateTwo(Cbs2_Man_t *, int, int)");
          }
          goto LAB_0071ef37;
        }
        uVar11 = uVar3 - (uVar11 & 0x1fffffff);
        if (((int)uVar11 < 0) || (uVar9 = (p->vAssign).nSize, (int)uVar9 <= (int)uVar11))
        goto LAB_0071eed4;
        pcVar7 = (p->vAssign).pArray;
        uVar11 = (uint)pcVar7[uVar11];
        uVar13 = (uint)(uVar6 >> 0x20);
        if ((int)uVar11 < 2) {
LAB_0071ed38:
          if (((ulong)pGVar1 & 1) != 0) {
LAB_0071ef37:
            __assert_fail("!Gia_IsComplement(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                          ,0x412,"int Cbs2_ManPropagateTwo(Cbs2_Man_t *, int, int)");
          }
          if (uVar9 <= uVar3) {
LAB_0071eed4:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          if ('\x01' < pcVar7[uVar3]) {
            __assert_fail("Cbs2_VarIsAssigned(p, iVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                          ,0x414,"int Cbs2_ManPropagateTwo(Cbs2_Man_t *, int, int)");
          }
          if (pcVar7[uVar3] != '\0') {
            __assert_fail("Cbs2_VarValue(p, iVar) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                          ,0x415,"int Cbs2_ManPropagateTwo(Cbs2_Man_t *, int, int)");
          }
          uVar15 = uVar3 - (uVar13 & 0x1fffffff);
          if (((int)uVar15 < 0) || (uVar9 <= uVar15)) goto LAB_0071eed4;
          uVar9 = (uint)(uVar6 >> 0x1d) & 1;
          cVar2 = pcVar7[uVar15];
          p->nPropCalls[1] = p->nPropCalls[1] + 1;
          if ((uVar9 != uVar11) && (uVar13 = uVar13 >> 0x1d & 1, uVar13 != (int)cVar2)) {
            uVar9 = uVar9 ^ uVar11;
            uVar13 = uVar13 ^ (int)cVar2;
            if ((uVar9 == 1) && (uVar13 == 1)) {
              iVar10 = Cbs2_ManAnalyze(p,Level,uVar3,uVar3 - ((uint)*(ulong *)pGVar1 & 0x1fffffff),
                                       uVar3 - ((uint)(*(ulong *)pGVar1 >> 0x20) & 0x1fffffff));
              if (iVar10 != 0) {
                return iVar10;
              }
            }
            else {
              if ((uVar9 != 1) && (uVar13 != 1)) {
                __assert_fail("Value0 == 1 || Value1 == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                              ,0x41e,"int Cbs2_ManPropagateTwo(Cbs2_Man_t *, int, int)");
              }
              if (1 < (int)uVar9) {
                uVar6 = *(ulong *)pGVar1;
                iVar10 = uVar3 - ((uint)uVar6 & 0x1fffffff);
                if (iVar10 < 0) goto LAB_0071efd2;
                Cbs2_ManAssign(p,((uint)(uVar6 >> 0x1d) & 1) + iVar10 * 2 ^ 1,Level,uVar3,
                               uVar3 - ((uint)(uVar6 >> 0x20) & 0x1fffffff));
              }
              if (1 < (int)uVar13) {
                uVar11 = (uint)(*(ulong *)pGVar1 >> 0x20);
                iVar10 = uVar3 - (uVar11 & 0x1fffffff);
                if (iVar10 < 0) {
LAB_0071efd2:
                  __assert_fail("Var >= 0 && !(c >> 1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                ,0x12e,"int Abc_Var2Lit(int, int)");
                }
                Cbs2_ManAssign(p,(uVar11 >> 0x1d & 1) + iVar10 * 2 ^ 1,Level,uVar3,
                               uVar3 - ((uint)*(ulong *)pGVar1 & 0x1fffffff));
              }
            }
          }
        }
        else {
          uVar15 = uVar3 - (uVar13 & 0x1fffffff);
          if (((int)uVar15 < 0) || (uVar9 <= uVar15)) goto LAB_0071eed4;
          if (pcVar7[uVar15] < '\x02') goto LAB_0071ed38;
          lVar12 = (long)iVar8;
          iVar8 = iVar8 + 1;
          piVar4[lVar12] = uVar3;
        }
        iVar10 = (p->pJust).iTail;
        if (iVar10 <= lVar14) break;
        piVar4 = (p->pJust).pData;
        uVar3 = piVar4[lVar14];
      }
    }
    if (iVar8 == iVar10) {
      return 0;
    }
    (p->pJust).iTail = iVar8;
  } while( true );
}

Assistant:

int Cbs2_ManPropagate( Cbs2_Man_t * p, int Level )
{
    while ( 1 )
    {
        int i, k, iVar, iLit, hClause;
        Cbs2_QueForEachEntry( p->pProp, iLit, i )
        {
            if ( (hClause = Cbs2_ManPropagateOne( p, Abc_Lit2Var(iLit), Level )) )
                return hClause;
        }
        p->pProp.iHead = p->pProp.iTail;
        k = p->pJust.iHead;
        Cbs2_QueForEachEntry( p->pJust, iVar, i )
        {
            if ( Cbs2_VarIsJust(p, Gia_ManObj(p->pAig, iVar), iVar) )
                p->pJust.pData[k++] = iVar;
            else if ( (hClause = Cbs2_ManPropagateTwo( p, iVar, Level )) )
                return hClause;
        }
        if ( k == p->pJust.iTail )
            break;
        p->pJust.iTail = k;
    }
    return 0;
}